

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O0

ntuple_list
LineSegmentDetection
          (image_double image,double scale,double sigma_scale,double quant,double ang_th,double eps,
          double density_th,int n_bins,double max_grad,image_int *region)

{
  int iVar1;
  image_int piVar2;
  double __x;
  double __x_00;
  double dVar3;
  double dVar4;
  int local_144;
  int ls_count;
  double logNT;
  double log_nfa;
  double p;
  double prec;
  double reg_angle;
  double rho;
  uint local_108;
  uint ysize;
  uint xsize;
  int i;
  int min_reg_size;
  int reg_size;
  point *reg;
  rect rec;
  void *mem_p;
  coorlist *list_p;
  image_char used;
  image_double modgrad;
  image_double angles;
  image_double scaled_image;
  ntuple_list out;
  image_int *region_local;
  double max_grad_local;
  double dStack_40;
  int n_bins_local;
  double density_th_local;
  double eps_local;
  double ang_th_local;
  double quant_local;
  double sigma_scale_local;
  double scale_local;
  image_double image_local;
  
  out = (ntuple_list)region;
  region_local = (image_int *)max_grad;
  max_grad_local._4_4_ = n_bins;
  dStack_40 = density_th;
  density_th_local = eps;
  eps_local = ang_th;
  ang_th_local = quant;
  quant_local = sigma_scale;
  sigma_scale_local = scale;
  scale_local = (double)image;
  scaled_image = (image_double)new_ntuple_list(5);
  local_144 = 0;
  if ((((scale_local == 0.0) || (*(long *)scale_local == 0)) ||
      (*(int *)((long)scale_local + 8) == 0)) || (*(int *)((long)scale_local + 0xc) == 0)) {
    error("invalid image input.");
  }
  if (sigma_scale_local <= 0.0) {
    error("\'scale\' value must be positive.");
  }
  if (quant_local <= 0.0) {
    error("\'sigma_scale\' value must be positive.");
  }
  if (ang_th_local < 0.0) {
    error("\'quant\' value must be positive.");
  }
  if ((eps_local <= 0.0) || (180.0 <= eps_local)) {
    error("\'ang_th\' value must be in the range (0,180).");
  }
  if ((dStack_40 < 0.0) || (1.0 < dStack_40)) {
    error("\'density_th\' value must be in the range [0,1].");
  }
  if ((int)max_grad_local._4_4_ < 1) {
    error("\'n_bins\' value must be positive.");
  }
  if ((double)region_local <= 0.0) {
    error("\'max_grad\' value must be positive.");
  }
  dVar4 = ang_th_local;
  __x = (eps_local * 3.141592653589793) / 180.0;
  __x_00 = eps_local / 180.0;
  dVar3 = sin(__x);
  reg_angle = dVar4 / dVar3;
  if ((sigma_scale_local != 1.0) || (NAN(sigma_scale_local))) {
    angles = gaussian_sampler((image_double)scale_local,sigma_scale_local,quant_local);
    modgrad = ll_angle(angles,reg_angle,(coorlist **)&mem_p,(void **)&rec.p,(image_double *)&used,
                       max_grad_local._4_4_,(double)region_local);
    free_image_double(angles);
  }
  else {
    modgrad = ll_angle((image_double)scale_local,reg_angle,(coorlist **)&mem_p,(void **)&rec.p,
                       (image_double *)&used,max_grad_local._4_4_,(double)region_local);
  }
  local_108 = modgrad->xsize;
  rho._4_4_ = modgrad->ysize;
  dVar4 = log10((double)local_108);
  dVar3 = log10((double)rho._4_4_);
  dVar4 = ((dVar4 + dVar3) * 5.0) / 2.0;
  dVar3 = log10(__x_00);
  xsize = (uint)(-dVar4 / dVar3);
  if (out != (ntuple_list)0x0) {
    piVar2 = new_image_int_ini(modgrad->xsize,modgrad->ysize,0);
    *(image_int *)out = piVar2;
  }
  list_p = (coorlist *)new_image_char_ini(local_108,rho._4_4_,'\0');
  _min_reg_size = (point *)calloc((ulong)(local_108 * rho._4_4_),8);
  if (_min_reg_size == (point *)0x0) {
    error("not enough memory!");
  }
  for (; mem_p != (void *)0x0; mem_p = *(void **)((long)mem_p + 8)) {
    if ((*(char *)(*(long *)list_p +
                  (ulong)(uint)(*mem_p + *(int *)((long)mem_p + 4) * *(int *)&list_p->next)) == '\0'
        ) && (((modgrad->data[*mem_p + *(int *)((long)mem_p + 4) * modgrad->xsize] != -1024.0 ||
               (NAN(modgrad->data[*mem_p + *(int *)((long)mem_p + 4) * modgrad->xsize]))) &&
              (region_grow(*mem_p,*(int *)((long)mem_p + 4),modgrad,_min_reg_size,&i,&prec,
                           (image_char)list_p,__x), (int)xsize <= i)))) {
      region2rect(_min_reg_size,i,(image_double)used,prec,__x,__x_00,(rect *)&reg);
      iVar1 = refine(_min_reg_size,&i,(image_double)used,prec,__x,__x_00,(rect *)&reg,
                     (image_char)list_p,modgrad,dStack_40);
      if ((iVar1 != 0) &&
         (dVar3 = rect_improve((rect *)&reg,modgrad,dVar4,density_th_local),
         density_th_local < dVar3)) {
        local_144 = local_144 + 1;
        reg = (point *)((double)reg + 0.5);
        rec.x1 = rec.x1 + 0.5;
        rec.y1 = rec.y1 + 0.5;
        rec.x2 = rec.x2 + 0.5;
        if ((sigma_scale_local != 1.0) || (NAN(sigma_scale_local))) {
          reg = (point *)((double)reg / sigma_scale_local);
          rec.x1 = rec.x1 / sigma_scale_local;
          rec.y1 = rec.y1 / sigma_scale_local;
          rec.x2 = rec.x2 / sigma_scale_local;
          rec.y2 = rec.y2 / sigma_scale_local;
        }
        add_5tuple((ntuple_list)scaled_image,(double)reg,rec.x1,rec.y1,rec.x2,rec.y2);
        if (out != (ntuple_list)0x0) {
          for (ysize = 0; (int)ysize < i; ysize = ysize + 1) {
            *(int *)(**(long **)out +
                    (ulong)(uint)(_min_reg_size[(int)ysize].x +
                                 _min_reg_size[(int)ysize].y * *(int *)(*(long *)out + 8)) * 4) =
                 local_144;
          }
        }
      }
    }
  }
  free_image_double(modgrad);
  free_image_double((image_double)used);
  free_image_char((image_char)list_p);
  free(_min_reg_size);
  free((void *)rec.p);
  return (ntuple_list)scaled_image;
}

Assistant:

ntuple_list LineSegmentDetection( image_double image, double scale,
                                  double sigma_scale, double quant,
                                  double ang_th, double eps, double density_th,
                                  int n_bins, double max_grad,
                                  image_int *region )
{
    ntuple_list out = new_ntuple_list(5);
    image_double scaled_image, angles, modgrad;
    image_char used;
    struct coorlist *list_p;
    void *mem_p;
    struct rect rec;
    struct point *reg;
    int reg_size, min_reg_size, i;
    unsigned int xsize, ysize;
    double rho, reg_angle, prec, p, log_nfa, logNT;
    int ls_count = 0;                   /* line segments are numbered 1,2,3,... */


    /* check parameters */
    if ( image == NULL || image->data == NULL || image->xsize == 0 || image->ysize == 0 )
        error("invalid image input.");
    if ( scale <= 0.0 ) error("'scale' value must be positive.");
    if ( sigma_scale <= 0.0 ) error("'sigma_scale' value must be positive.");
    if ( quant < 0.0 ) error("'quant' value must be positive.");
    if ( ang_th <= 0.0 || ang_th >= 180.0 )
        error("'ang_th' value must be in the range (0,180).");
    if ( density_th < 0.0 || density_th > 1.0 )
        error("'density_th' value must be in the range [0,1].");
    if ( n_bins <= 0 ) error("'n_bins' value must be positive.");
    if ( max_grad <= 0.0 ) error("'max_grad' value must be positive.");


    /* angle tolerance */
    prec = M_PI * ang_th / 180.0;
    p = ang_th / 180.0;
    rho = quant / sin(prec); /* gradient magnitude threshold */


    /* scale image (if necessary) and compute angle at each pixel */
    if ( scale != 1.0 )
    {
        scaled_image = gaussian_sampler( image, scale, sigma_scale );
        angles = ll_angle( scaled_image, rho, &list_p, &mem_p,
                           &modgrad, (unsigned int) n_bins, max_grad );
        free_image_double(scaled_image);
    }
    else
        angles = ll_angle( image, rho, &list_p, &mem_p, &modgrad,
                           (unsigned int) n_bins, max_grad );
    xsize = angles->xsize;
    ysize = angles->ysize;
    logNT = 5.0 * ( log10( (double) xsize ) + log10( (double) ysize ) ) / 2.0;
    min_reg_size = (int) (-logNT / log10(p)); /* minimal number of points in region
                                             that can give a meaningful event */


    /* initialize some structures */
    if ( region != NULL ) /* image to output pixel region number, if asked */
        *region = new_image_int_ini(angles->xsize, angles->ysize, 0);
    used = new_image_char_ini(xsize, ysize, NOTUSED);
    reg = (struct point *) calloc( (size_t) (xsize * ysize), sizeof(struct point) );
    if ( reg == NULL ) error("not enough memory!");


    /* search for line segments */
    for (; list_p != NULL; list_p = list_p->next )
        if ( used->data[ list_p->x + list_p->y * used->xsize ] == NOTUSED &&
                angles->data[ list_p->x + list_p->y * angles->xsize ] != NOTDEF )
            /* there is no risk of double comparison problems here
               because we are only interested in the exact NOTDEF value */
        {
            /* find the region of connected point and ~equal angle */
            region_grow( list_p->x, list_p->y, angles, reg, &reg_size,
                         &reg_angle, used, prec );

            /* reject small regions */
            if ( reg_size < min_reg_size ) continue;

            /* construct rectangular approximation for the region */
            region2rect(reg, reg_size, modgrad, reg_angle, prec, p, &rec);

            /* Check if the rectangle exceeds the minimal density of
               region points. If not, try to improve the region.
               The rectangle will be rejected if the final one does
               not fulfill the minimal density condition.
               This is an addition to the original LSD algorithm published in
               "LSD: A Fast Line Segment Detector with a False Detection Control"
               by R. Grompone von Gioi, J. Jakubowicz, J.M. Morel, and G. Randall.
               The original algorithm is obtained with density_th = 0.0.
             */
            if ( !refine( reg, &reg_size, modgrad, reg_angle,
                          prec, p, &rec, used, angles, density_th ) ) continue;

            /* compute NFA value */
            log_nfa = rect_improve(&rec, angles, logNT, eps);
            if ( log_nfa <= eps ) continue;

            /* A New Line Segment was found! */
            ++ls_count;  /* increase line segment counter */

            /*
               The gradient was computed with a 2x2 mask, its value corresponds to
               points with an offset of (0.5,0.5), that should be added to output.
               The coordinates origin is at the center of pixel (0,0).
             */
            rec.x1 += 0.5; rec.y1 += 0.5;
            rec.x2 += 0.5; rec.y2 += 0.5;

            /* scale the result values if a subsampling was performed */
            if ( scale != 1.0 )
            {
                rec.x1 /= scale; rec.y1 /= scale;
                rec.x2 /= scale; rec.y2 /= scale;
                rec.width /= scale;
            }

            /* add line segment found to output */
            add_5tuple(out, rec.x1, rec.y1, rec.x2, rec.y2, rec.width);

            /* add region number to 'region' image if needed */
            if ( region != NULL )
                for (i = 0; i < reg_size; i++)
                    (*region)->data[reg[i].x + reg[i].y * (*region)->xsize] = ls_count;
        }


    /* free memory */
    free_image_double(angles);
    free_image_double(modgrad);
    free_image_char(used);
    free( (void *) reg );
    free( (void *) mem_p );

    return out;
}